

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginElemExpr
          (BinaryReaderInterp *this,Index elem_index,Index expr_index)

{
  pointer pEVar1;
  ValueType VVar2;
  pointer pFVar3;
  Result RVar4;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_c0;
  FuncDesc local_a8;
  
  pEVar1 = (this->module_->elems).
           super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((long)pEVar1 -
       (long)(this->module_->elems).
             super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
             _M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333 - 1U !=
      (ulong)elem_index) {
    __assert_fail("elem_index == module_.elems.size() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                  ,0x2f6,
                  "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::BeginElemExpr(Index, Index)"
                 );
  }
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar2 = pEVar1[-1].type;
  local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start = VVar2;
  local_a8.type.super_ExternType.kind = First;
  local_a8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_a8.type.params,&local_d8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_a8.type.results,&local_c0);
  local_a8.locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.code_offset = 0xffffffff;
  local_a8.handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::
  emplace_back<wabt::interp::FuncDesc>(&pEVar1[-1].elements,&local_a8);
  std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
            (&local_a8.handlers);
  if (local_a8.locals.
      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.locals.
                    super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_a8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  if (local_a8.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.type.results.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (ValueType *)0x0) {
    operator_delete(local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pFVar3 = pEVar1[-1].elements.
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((long)pFVar3 -
       (long)pEVar1[-1].elements.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111 - 1U ==
      (ulong)expr_index) {
    RVar4 = BeginInitExpr(this,pFVar3 + -1);
    return (Result)RVar4.enum_;
  }
  __assert_fail("expr_index == elem.elements.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                ,0x2fa,
                "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::BeginElemExpr(Index, Index)"
               );
}

Assistant:

Result BinaryReaderInterp::BeginElemExpr(Index elem_index, Index expr_index) {
  assert(elem_index == module_.elems.size() - 1);
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(
      {FuncType{{}, {elem.type}}, {}, Istream::kInvalidOffset, {}});
  assert(expr_index == elem.elements.size() - 1);
  return BeginInitExpr(&elem.elements.back());
}